

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errhandl.c
# Opt level: O1

void WriteLASErrDescr(FILE *File)

{
  size_t __size;
  char *pcVar1;
  char cVar2;
  
  if (LASErrId != LASOK) {
    if (LASProcName != (char *)0x0) {
      fprintf((FILE *)File,"in %s");
      if (((LASObject1Name != (char *)0x0) || (LASObject2Name != (char *)0x0)) ||
         (LASObject3Name != (char *)0x0)) {
        fwrite(" for ",5,1,(FILE *)File);
      }
      pcVar1 = LASObject1Name;
      cVar2 = LASObject1Name != (char *)0x0;
      if ((bool)cVar2) {
        fputs(LASObject1Name,(FILE *)File);
      }
      if (LASObject2Name != (char *)0x0) {
        if (pcVar1 != (char *)0x0) {
          fwrite(", ",2,1,(FILE *)File);
        }
        fputs(LASObject2Name,(FILE *)File);
        cVar2 = cVar2 + '\x01';
      }
      if (LASObject3Name != (char *)0x0) {
        if (cVar2 != '\0') {
          fwrite(", ",2,1,(FILE *)File);
        }
        fputs(LASObject3Name,(FILE *)File);
      }
      fputc(0x3a,(FILE *)File);
    }
    fputc(10,(FILE *)File);
  }
  switch(LASErrId) {
  case LASMemAllocErr:
    pcVar1 = "Not enough memory is available.\n";
    goto LAB_0011082d;
  case LASLValErr:
    pcVar1 = "L-value parameter is expected.\n";
    __size = 0x1f;
    break;
  case LASDimErr:
    pcVar1 = "Objects have incompatible dimensions.\n";
    __size = 0x26;
    break;
  case LASRangeErr:
    pcVar1 = "Indices are out of range.\n";
    __size = 0x1a;
    break;
  case LASSymStorErr:
    fwrite("Some elements are stored in lower triangular part",0x31,1,(FILE *)File);
    pcVar1 = " of a symmetric matrix.\n";
    goto LAB_001107e9;
  case LASMatrCombErr:
    pcVar1 = "Matrices can not be combined.\n";
    goto LAB_00110849;
  case LASMulInvErr:
    pcVar1 = "Inverse multiplication can not be carried out.\n";
    __size = 0x2f;
    break;
  case LASElNotSortedErr:
    pcVar1 = "Matrix elements are not sorted.\n";
LAB_0011082d:
    __size = 0x20;
    break;
  case LASZeroInDiagErr:
    pcVar1 = "Zero elements in matrix diagonal are not allowed.\n";
    __size = 0x32;
    break;
  case LASZeroPivotErr:
    pcVar1 = "Factorization produces zero pivot elements.\n";
    __size = 0x2c;
    break;
  case LASILUStructErr:
    pcVar1 = "Matrix has structure which is not allowed for ILU factorization.\n";
    __size = 0x41;
    break;
  case LASBreakdownErr:
    pcVar1 = "Iterative solver fails.\n";
LAB_001107e9:
    __size = 0x18;
    break;
  case LASUserBreak:
    pcVar1 = "Termination by an user break.\n";
LAB_00110849:
    __size = 0x1e;
    break;
  default:
    return;
  }
  fwrite(pcVar1,__size,1,(FILE *)File);
  return;
}

Assistant:

void WriteLASErrDescr(FILE *File)
/* write a short description of the reason caused break of LASPack */
{
    int NoPrintedObj;
    
    if (LASErrId != LASOK) {
	if (LASProcName != NULL) {
            fprintf(File, "in %s", LASProcName);
	    NoPrintedObj = 0;
	    if (LASObject1Name != NULL || LASObject2Name != NULL
		|| LASObject3Name != NULL)
                fprintf(File, " for ");
	    if (LASObject1Name != NULL) {
	        if (NoPrintedObj > 0)
                    fprintf(File, ", ");
                fprintf(File, "%s", LASObject1Name);
		NoPrintedObj++;
	    }
	    if (LASObject2Name != NULL) {
	        if (NoPrintedObj > 0)
                    fprintf(File, ", ");
                fprintf(File, "%s", LASObject2Name);
		NoPrintedObj++;
	    }
	    if (LASObject3Name != NULL) {
	        if (NoPrintedObj > 0)
                    fprintf(File, ", ");
                fprintf(File, "%s", LASObject3Name);
		NoPrintedObj++;
	    }
            fprintf(File, ":");
        }
        fprintf(File, "\n");
    }
    
    switch (LASErrId) {
        case LASOK:
            break;
        case LASMemAllocErr:
	    fprintf(File, "Not enough memory is available.\n");
            break;
        case LASLValErr:
	    fprintf(File, "L-value parameter is expected.\n");
            break;
        case LASDimErr:
	    fprintf(File, "Objects have incompatible dimensions.\n");
            break;
        case LASRangeErr:
	    fprintf(File, "Indices are out of range.\n");
            break;
        case LASSymStorErr:
	    fprintf(File, "Some elements are stored in lower triangular part");
	    fprintf(File, " of a symmetric matrix.\n");
            break;
        case LASMatrCombErr:
	    fprintf(File, "Matrices can not be combined.\n");
            break;
        case LASMulInvErr:
	    fprintf(File, "Inverse multiplication can not be carried out.\n");
            break;
        case LASElNotSortedErr:
	    fprintf(File, "Matrix elements are not sorted.\n");
            break;
        case LASZeroInDiagErr:
	    fprintf(File, "Zero elements in matrix diagonal are not allowed.\n");
            break;
        case LASZeroPivotErr:
	    fprintf(File, "Factorization produces zero pivot elements.\n");
            break;
        case LASILUStructErr:
	    fprintf(File, "Matrix has structure which is not allowed for ILU factorization.\n");
            break;
        case LASBreakdownErr:
	    fprintf(File, "Iterative solver fails.\n");
            break;
        case LASUserBreak:
	    fprintf(File, "Termination by an user break.\n");
            break;
    }
}